

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

int32_t u_getISOComment_63(UChar32 param_1,char *dest,int32_t destCapacity,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode *pErrorCode_local;
  int32_t destCapacity_local;
  char *dest_local;
  UChar32 param_0_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    return 0;
  }
  if ((-1 < destCapacity) && ((destCapacity < 1 || (dest != (char *)0x0)))) {
    iVar2 = u_terminateChars_63(dest,destCapacity,0,pErrorCode);
    return iVar2;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_getISOComment(UChar32 /*c*/,
                char *dest, int32_t destCapacity,
                UErrorCode *pErrorCode) {
    /* check the argument values */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    } else if(destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    return u_terminateChars(dest, destCapacity, 0, pErrorCode);
}